

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(ChArchiveOut *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  type_index local_30;
  _Node_iterator_base<std::pair<const_std::type_index,_int>,_false> local_28;
  type_index local_20;
  _Node_iterator_base<std::pair<const_std::type_index,_int>,_false> local_18;
  ChArchiveOut *local_10;
  ChArchiveOut *this_local;
  
  if (((this->super_ChArchive).use_versions & 1U) != 0) {
    local_10 = this;
    if (((this->super_ChArchive).cluster_class_versions & 1U) == 0) {
      (*(this->super_ChArchive)._vptr_ChArchive[0x11])
                (this,0,&myEmployeeCustomConstructor::typeinfo);
    }
    else {
      std::type_index::type_index(&local_20,(type_info *)&myEmployeeCustomConstructor::typeinfo);
      local_18._M_cur =
           (__node_type *)
           std::
           unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
           ::find(&(this->super_ChArchive).class_versions,&local_20);
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
           ::end(&(this->super_ChArchive).class_versions);
      bVar1 = std::__detail::operator==(&local_18,&local_28);
      if (bVar1) {
        (*(this->super_ChArchive)._vptr_ChArchive[0x11])
                  (this,0,&myEmployeeCustomConstructor::typeinfo);
        std::type_index::type_index(&local_30,(type_info *)&myEmployeeCustomConstructor::typeinfo);
        pmVar2 = std::
                 unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
                 ::operator[](&(this->super_ChArchive).class_versions,&local_30);
        *pmVar2 = 0;
      }
    }
  }
  return;
}

Assistant:

void VersionWrite() {
          if (!use_versions)
              return;
          if (this->cluster_class_versions) {
              if (this->class_versions.find(std::type_index(typeid(T))) == this->class_versions.end()) {
                this->out_version(chrono::class_factory::ChClassVersion<T>::version, typeid(T));
                this->class_versions[std::type_index(typeid(T))] = chrono::class_factory::ChClassVersion<T>::version;
              } 
          } 
          else {
              this->out_version(chrono::class_factory::ChClassVersion<T>::version, typeid(T));
          }
      }